

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyTable.c
# Opt level: O0

uint Ivy_Hash(Ivy_Obj_t *pObj,int TableSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Ivy_Init_t IVar6;
  uint Key;
  int TableSize_local;
  Ivy_Obj_t *pObj_local;
  
  iVar1 = Ivy_ObjIsExor(pObj);
  iVar2 = Ivy_ObjFaninId0(pObj);
  iVar3 = Ivy_ObjFaninId1(pObj);
  iVar4 = Ivy_ObjFaninC0(pObj);
  iVar5 = Ivy_ObjFaninC1(pObj);
  IVar6 = Ivy_ObjInit(pObj);
  return (IVar6 * 0x38f ^
         iVar5 * 0x161 ^ iVar4 * 0x38f ^ iVar3 * 0xb9b ^ iVar2 * 0x1f01 ^ iVar1 * 0x6a3) %
         (uint)TableSize;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

// hashing the node
static unsigned Ivy_Hash( Ivy_Obj_t * pObj, int TableSize ) 
{
    unsigned Key = Ivy_ObjIsExor(pObj) * 1699;
    Key ^= Ivy_ObjFaninId0(pObj) * 7937;
    Key ^= Ivy_ObjFaninId1(pObj) * 2971;
    Key ^= Ivy_ObjFaninC0(pObj) * 911;
    Key ^= Ivy_ObjFaninC1(pObj) * 353;
    Key ^= Ivy_ObjInit(pObj) * 911;
    return Key % TableSize;
}